

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O2

t_object *
xemmai::
f_new_value<xemmai::t_object*,xemmai::t_value<xemmai::t_pointer>,xemmai::t_value<xemmai::t_pointer>>
          (t_type *a_type,t_object **a_xs,t_value<xemmai::t_pointer> *a_xs_1,
          t_value<xemmai::t_pointer> *a_xs_2)

{
  t_queue<128UL> *this;
  t_queue<256UL> *this_00;
  long *plVar1;
  undefined8 *puVar2;
  t_object *ptVar3;
  
  if (a_type->v_fields_offset != 0x48) {
    __assert_fail("a_type->v_fields_offset == t_object::f_fields_offset(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/include/xemmai/engine.h"
                  ,0x173,
                  "t_object *xemmai::f_new_value(t_type *, auto &&...) [a_xs:auto = <xemmai::t_object *, xemmai::t_value<xemmai::t_pointer>, xemmai::t_value<xemmai::t_pointer>>]"
                 );
  }
  if (a_type->v_instance_fields == 3) {
    plVar1 = (long *)__tls_get_addr(&PTR_00126de0);
    ptVar3 = (t_object *)*plVar1;
    if (ptVar3 == (t_object *)0x0) {
      plVar1 = (long *)__tls_get_addr(&PTR_00126d08);
      ptVar3 = t_heap<xemmai::t_object>::f_allocate_from<0ul,65536ul>
                         ((t_heap<xemmai::t_object> *)(*plVar1 + 0x30),
                          (t_of<0UL,_65536UL> *)(*plVar1 + 0x90));
    }
    else {
      *plVar1 = (long)ptVar3->v_next;
    }
    ptVar3->v_next = (t_object *)0x0;
    f__construct<0ul,1ul,2ul,xemmai::t_object*,xemmai::t_value<xemmai::t_pointer>,xemmai::t_value<xemmai::t_pointer>>
              (ptVar3->v_data,a_xs,a_xs_1,a_xs_2);
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_00126ce0);
    this = (t_queue<128UL> *)*puVar2;
    *this->v_head = (t_object *)&a_type[-1].f_less;
    if (this->v_head == this->v_next) {
      t_slot::t_queue<128UL>::f_next(this);
    }
    else {
      this->v_head = this->v_head + 1;
    }
    ptVar3->v_type = a_type;
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_00126d30);
    this_00 = (t_queue<256UL> *)*puVar2;
    *this_00->v_head = ptVar3;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<256UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
    return ptVar3;
  }
  __assert_fail("a_type->v_instance_fields == sizeof...(a_xs)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/include/xemmai/engine.h"
                ,0x174,
                "t_object *xemmai::f_new_value(t_type *, auto &&...) [a_xs:auto = <xemmai::t_object *, xemmai::t_value<xemmai::t_pointer>, xemmai::t_value<xemmai::t_pointer>>]"
               );
}

Assistant:

inline t_object* f_new_value(t_type* a_type, auto&&... a_xs)
{
	assert(a_type->v_fields_offset == t_object::f_fields_offset(0));
	assert(a_type->v_instance_fields == sizeof...(a_xs));
	auto p = f_engine()->f_allocate(sizeof(t_svalue) * sizeof...(a_xs));
	f__construct(p->f_fields(0), std::make_index_sequence<sizeof...(a_xs)>(), std::forward<decltype(a_xs)>(a_xs)...);
	p->f_be(a_type);
	return p;
}